

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall particleSamples::read_in_particle_samples_mixed_event(particleSamples *this)

{
  particleSamples *this_00;
  
  this_00 = this;
  switch(this->read_in_mode_) {
  case 0:
    read_in_particle_samples_OSCAR_mixed_event(this);
    this->resonance_weak_feed_down_flag = 0;
    break;
  case 1:
    read_in_particle_samples_UrQMD_mixed_event(this);
    break;
  case 2:
    read_in_particle_samples_UrQMD_mixed_event_zipped(this);
    break;
  case 3:
    read_in_particle_samples_mixed_event_Sangwook(this);
    break;
  case 4:
    read_in_particle_samples_UrQMD_3p3_mixed_event(this);
    break;
  case 5:
    read_in_particle_samples_JAM_mixed_event(this);
    break;
  case 7:
    read_in_particle_samples_SMASH_mixed_event_gzipped(this);
    break;
  case 8:
    read_in_particle_samples_SMASH_binary
              (this,&this->inputfile_mixed_event,this->full_particle_list_mixed_event);
    break;
  case 9:
    read_in_particle_samples_mixed_event_binary(this);
    break;
  case 10:
    read_in_particle_samples_mixed_event_gzipped(this);
    break;
  case 0x15:
    read_in_particle_samples_UrQMD_mixed_event_binary(this);
  }
  boostParticles(this_00,this->full_particle_list_mixed_event,this->rap_shift_);
  if (this->resonance_feed_down_flag == 1) {
    perform_resonance_feed_down(this,this->full_particle_list_mixed_event);
  }
  addParticleQuantumNumber(this,this->full_particle_list_mixed_event);
  return (int)((ulong)((long)(this->full_particle_list_mixed_event->
                             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->full_particle_list_mixed_event->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int particleSamples::read_in_particle_samples_mixed_event() {
    if (read_in_mode_ == 0) {
        read_in_particle_samples_OSCAR_mixed_event();
        resonance_weak_feed_down_flag = 0;
    } else if (read_in_mode_ == 1) {
        read_in_particle_samples_UrQMD_mixed_event();
    } else if (read_in_mode_ == 2) {
        read_in_particle_samples_UrQMD_mixed_event_zipped();
    } else if (read_in_mode_ == 21) {
        read_in_particle_samples_UrQMD_mixed_event_binary();
    } else if (read_in_mode_ == 3) {
        read_in_particle_samples_mixed_event_Sangwook();
    } else if (read_in_mode_ == 4) {
        read_in_particle_samples_UrQMD_3p3_mixed_event();
    } else if (read_in_mode_ == 5) {
        read_in_particle_samples_JAM_mixed_event();
    } else if (read_in_mode_ == 7) {
        read_in_particle_samples_SMASH_mixed_event_gzipped();
    } else if (read_in_mode_ == 8) {
        read_in_particle_samples_SMASH_binary(
            inputfile_mixed_event, full_particle_list_mixed_event);
    } else if (read_in_mode_ == 9) {
        read_in_particle_samples_mixed_event_binary();
    } else if (read_in_mode_ == 10) {
        read_in_particle_samples_mixed_event_gzipped();
    }

    boostParticles(full_particle_list_mixed_event, rap_shift_);

    if (resonance_feed_down_flag == 1)
        perform_resonance_feed_down(full_particle_list_mixed_event);
    addParticleQuantumNumber(full_particle_list_mixed_event);
    return (full_particle_list_mixed_event->size());
}